

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O0

void MapConfigToTools(VP8Encoder *enc)

{
  int iVar1;
  WebPConfig *pWVar2;
  undefined1 auVar3 [16];
  int iVar4;
  bool local_21;
  VP8RDLevel local_20;
  VP8RDLevel local_1c;
  int limit;
  int method;
  WebPConfig *config;
  VP8Encoder *enc_local;
  
  pWVar2 = enc->config;
  iVar1 = pWVar2->method;
  iVar4 = 100 - pWVar2->partition_limit;
  enc->method = iVar1;
  if (iVar1 < 6) {
    if (iVar1 < 5) {
      local_20 = (VP8RDLevel)(2 < iVar1);
    }
    else {
      local_20 = RD_OPT_TRELLIS;
    }
    local_1c = local_20;
  }
  else {
    local_1c = RD_OPT_TRELLIS_ALL;
  }
  enc->rd_opt_level = local_1c;
  enc->max_i4_header_bits = (iVar4 * iVar4 * 0x10000) / 10000;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = SUB168(SEXT816(0x3fc00000),8);
  enc->mb_header_limit =
       SUB164((auVar3 << 0x40 | ZEXT816(0x3fc00000)) / SEXT816((long)(enc->mb_w * enc->mb_h)),0);
  enc->thread_level = pWVar2->thread_level;
  local_21 = true;
  if (pWVar2->target_size < 1) {
    local_21 = 0.0 < pWVar2->target_PSNR;
  }
  enc->do_search = (uint)local_21;
  if ((pWVar2->low_memory == 0) &&
     (enc->use_tokens = (uint)(enc->rd_opt_level != RD_OPT_NONE), enc->use_tokens != 0)) {
    enc->num_parts = 1;
  }
  return;
}

Assistant:

static void MapConfigToTools(VP8Encoder* const enc) {
  const WebPConfig* const config = enc->config;
  const int method = config->method;
  const int limit = 100 - config->partition_limit;
  enc->method = method;
  enc->rd_opt_level = (method >= 6) ? RD_OPT_TRELLIS_ALL
                    : (method >= 5) ? RD_OPT_TRELLIS
                    : (method >= 3) ? RD_OPT_BASIC
                    : RD_OPT_NONE;
  enc->max_i4_header_bits =
      256 * 16 * 16 *                 // upper bound: up to 16bit per 4x4 block
      (limit * limit) / (100 * 100);  // ... modulated with a quadratic curve.

  // partition0 = 512k max.
  enc->mb_header_limit =
      (score_t)256 * 510 * 8 * 1024 / (enc->mb_w * enc->mb_h);

  enc->thread_level = config->thread_level;

  enc->do_search = (config->target_size > 0 || config->target_PSNR > 0);
  if (!config->low_memory) {
#if !defined(DISABLE_TOKEN_BUFFER)
    enc->use_tokens = (enc->rd_opt_level >= RD_OPT_BASIC);  // need rd stats
#endif
    if (enc->use_tokens) {
      enc->num_parts = 1;   // doesn't work with multi-partition
    }
  }
}